

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<Assimp::FIIntValue> __thiscall
Assimp::FIIntValue::create(FIIntValue *this,vector<int,_std::allocator<int>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FIIntValue> sVar1;
  vector<int,_std::allocator<int>_> local_28;
  vector<int,_std::allocator<int>_> *value_local;
  
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)value;
  value_local = (vector<int,_std::allocator<int>_> *)this;
  std::make_shared<Assimp::FIIntValueImpl,std::vector<int,std::allocator<int>>>(&local_28);
  std::shared_ptr<Assimp::FIIntValue>::shared_ptr<Assimp::FIIntValueImpl,void>
            ((shared_ptr<Assimp::FIIntValue> *)this,(shared_ptr<Assimp::FIIntValueImpl> *)&local_28)
  ;
  std::shared_ptr<Assimp::FIIntValueImpl>::~shared_ptr
            ((shared_ptr<Assimp::FIIntValueImpl> *)&local_28);
  sVar1.super___shared_ptr<Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIIntValue>)
         sVar1.super___shared_ptr<Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIIntValue> FIIntValue::create(std::vector<int32_t> &&value) {
    return std::make_shared<FIIntValueImpl>(std::move(value));
}